

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O3

SchnorrSignature *
cfd::core::SchnorrUtil::Sign(SchnorrSignature *__return_storage_ptr__,ByteData256 *msg,Privkey *sk)

{
  ByteData local_38;
  
  ByteData::ByteData(&local_38);
  SignCommon(__return_storage_ptr__,msg,sk,(secp256k1_nonce_function_hardened *)0x0,&local_38);
  if (local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

SchnorrSignature SchnorrUtil::Sign(const ByteData256 &msg, const Privkey &sk) {
  return SignCommon(msg, sk, nullptr, ByteData());
}